

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Var_Decl(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,bool t_class_context,string *t_class_name)

{
  bool bVar1;
  bool bVar2;
  eval_error *peVar3;
  undefined7 in_register_00000031;
  string *this_00;
  size_t t_match_start;
  string_view t_match;
  string local_f0;
  Static_String local_d0;
  Static_String local_c0;
  Depth_Counter dc;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  Depth_Counter::Depth_Counter(&dc,this);
  t_match_start =
       (long)(this->m_match_stack).
             super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_match_stack).
             super__Vector_base<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  if ((int)CONCAT71(in_register_00000031,t_class_context) == 0) {
LAB_005663f9:
    local_f0._M_dataplus._M_p = &DAT_00000004;
    local_f0._M_string_length = 0x5a80ad;
    bVar1 = Keyword(this,(Static_String *)&local_f0);
    if (!bVar1) {
      local_d0.m_size = 3;
      local_d0.data = "var";
      bVar1 = Keyword(this,&local_d0);
      if (!bVar1) {
        local_f0._M_dataplus._M_p = (pointer)0x6;
        local_f0._M_string_length = 0x5a0223;
        bVar1 = Keyword(this,(Static_String *)&local_f0);
        if (bVar1) {
          bVar1 = Reference(this);
          if (!bVar1) {
            bVar1 = Id(this,true);
            if (!bVar1) {
              peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"Incomplete global declaration",
                         (allocator<char> *)&local_c0);
              local_d0.m_size._0_4_ = (this->m_position).line;
              local_d0.m_size._4_4_ = (this->m_position).col;
              exception::eval_error::eval_error
                        (peVar3,&local_f0,(File_Position *)&local_d0,
                         (this->m_filename).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error
                         );
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_88,"",(allocator<char> *)&local_f0);
          ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Global_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_88);
          this_00 = &local_88;
        }
        else {
          local_f0._M_dataplus._M_p = (pointer)0x4;
          local_f0._M_string_length = 0x5a30b9;
          bVar1 = Keyword(this,(Static_String *)&local_f0);
          if (!bVar1) {
            bVar1 = false;
            goto LAB_0056649a;
          }
          bVar1 = Id(this,true);
          if (!bVar1) {
            peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"Incomplete attribute declaration",
                       (allocator<char> *)&local_c0);
            local_d0.m_size._0_4_ = (this->m_position).line;
            local_d0.m_size._4_4_ = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar3,&local_f0,(File_Position *)&local_d0,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          local_f0._M_dataplus._M_p = (pointer)0x2;
          local_f0._M_string_length = 0x59e0f3;
          bVar1 = Symbol(this,(Static_String *)&local_f0,false);
          if (!bVar1) {
            peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"Incomplete attribute declaration",
                       (allocator<char> *)&local_c0);
            local_d0.m_size._0_4_ = (this->m_position).line;
            local_d0.m_size._4_4_ = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar3,&local_f0,(File_Position *)&local_d0,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          bVar1 = Id(this,true);
          if (!bVar1) {
            peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_f0,"Missing attribute name in definition",
                       (allocator<char> *)&local_c0);
            local_d0.m_size._0_4_ = (this->m_position).line;
            local_d0.m_size._4_4_ = (this->m_position).col;
            exception::eval_error::eval_error
                      (peVar3,&local_f0,(File_Position *)&local_d0,
                       (this->m_filename).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
            __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"",(allocator<char> *)&local_f0);
          ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Attr_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_a8);
          this_00 = &local_a8;
        }
        goto LAB_005663ec;
      }
    }
    bVar2 = Reference(this);
    bVar1 = true;
    if (!bVar2) {
      bVar2 = Id(this,true);
      if (!bVar2) {
        peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"Incomplete variable declaration",
                   (allocator<char> *)&local_c0);
        local_d0.m_size._0_4_ = (this->m_position).line;
        local_d0.m_size._4_4_ = (this->m_position).col;
        exception::eval_error::eval_error
                  (peVar3,&local_f0,(File_Position *)&local_d0,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"",(allocator<char> *)&local_f0);
      ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::build_match<chaiscript::eval::Var_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,t_match_start,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)0x4;
    local_f0._M_string_length = 0x5a30b9;
    bVar1 = Keyword(this,(Static_String *)&local_f0);
    if (!bVar1) {
      local_d0.m_size = 4;
      local_d0.data = "auto";
      bVar1 = Keyword(this,&local_d0);
      if (!bVar1) {
        local_c0.m_size = 3;
        local_c0.data = "var";
        bVar1 = Keyword(this,&local_c0);
        if (!bVar1) goto LAB_005663f9;
      }
    }
    t_match._M_str = (char *)t_class_name->_M_string_length;
    t_match._M_len = (size_t)this;
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::make_node<chaiscript::eval::Id_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)&local_f0,t_match,(int)(t_class_name->_M_dataplus)._M_p,(this->m_position).line);
    std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>>
    ::
    emplace_back<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>
              ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>>
                *)&this->m_match_stack,
               (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
                *)&local_f0);
    if ((long *)local_f0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f0._M_dataplus._M_p + 0x18))();
    }
    bVar1 = Id(this,true);
    if (!bVar1) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Incomplete attribute declaration",(allocator<char> *)&local_c0
                );
      local_d0.m_size._0_4_ = (this->m_position).line;
      local_d0.m_size._4_4_ = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar3,&local_f0,(File_Position *)&local_d0,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"",(allocator<char> *)&local_f0);
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Attr_Decl_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_48);
    this_00 = &local_48;
LAB_005663ec:
    std::__cxx11::string::~string((string *)this_00);
    bVar1 = true;
  }
LAB_0056649a:
  (dc.parser)->m_current_parse_depth = (dc.parser)->m_current_parse_depth - 1;
  return bVar1;
}

Assistant:

bool Var_Decl(const bool t_class_context = false, const std::string &t_class_name = "") {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (t_class_context && (Keyword("attr") || Keyword("auto") || Keyword("var"))) {
          retval = true;

          m_match_stack.push_back(make_node<eval::Id_AST_Node<Tracer>>(t_class_name, m_position.line, m_position.col));

          if (!Id(true)) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Attr_Decl_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("auto") || Keyword("var")) {
          retval = true;

          if (Reference()) {
            // we built a reference node - continue
          } else if (Id(true)) {
            build_match<eval::Var_Decl_AST_Node<Tracer>>(prev_stack_top);
          } else {
            throw exception::eval_error("Incomplete variable declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

        } else if (Keyword("global")) {
          retval = true;

          if (!(Reference() || Id(true))) {
            throw exception::eval_error("Incomplete global declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Global_Decl_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("attr")) {
          retval = true;

          if (!Id(true)) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }
          if (!Symbol("::")) {
            throw exception::eval_error("Incomplete attribute declaration", File_Position(m_position.line, m_position.col), *m_filename);
          }
          if (!Id(true)) {
            throw exception::eval_error("Missing attribute name in definition", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Attr_Decl_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }